

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism.cc
# Opt level: O0

HomomorphismResult * __thiscall
anon_unknown.dwarf_74545::SequentialSolver::solve(SequentialSolver *this)

{
  bool bVar1;
  SearchResult SVar2;
  uint uVar3;
  pointer pRVar4;
  HomomorphismModel *this_00;
  type __rhs;
  __enable_if_is_duration<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_> __rhs_00;
  size_type sVar5;
  long in_RSI;
  HomomorphismResult *in_RDI;
  pair<const_int,_int> *n_1;
  iterator __end3_1;
  iterator __begin3_1;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *__range3_1;
  string nogoods_lengths_str;
  Nogood<gss::innards::HomomorphismAssignment> *n;
  iterator __end3;
  iterator __begin3;
  NogoodStore *__range3;
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> nogoods_lengths;
  HomomorphismAssignments assignments_copy;
  HomomorphismSearcher searcher;
  uint number_of_restarts;
  bool done;
  time_point search_start_time;
  HomomorphismAssignments assignments;
  Domains domains;
  HomomorphismResult *result;
  undefined4 in_stack_ffffffffffffe738;
  uint in_stack_ffffffffffffe73c;
  HomomorphismSearcher *in_stack_ffffffffffffe740;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe748;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  value_type *in_stack_ffffffffffffe750;
  size_type in_stack_ffffffffffffe758;
  undefined7 in_stack_ffffffffffffe760;
  undefined1 in_stack_ffffffffffffe767;
  size_type in_stack_ffffffffffffe768;
  uint __val;
  vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
  *in_stack_ffffffffffffe770;
  DuplicateSolutionFilterer *in_stack_ffffffffffffe778;
  HomomorphismParams *in_stack_ffffffffffffe780;
  Watches<gss::innards::HomomorphismAssignment,_gss::innards::HomomorphismAssignmentWatchTable>
  *in_stack_ffffffffffffe788;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__lhs;
  HomomorphismSearcher *in_stack_ffffffffffffe790;
  HomomorphismResult *in_stack_ffffffffffffe830;
  HomomorphismAssignments *in_stack_ffffffffffffe838;
  HomomorphismSearcher *in_stack_ffffffffffffe840;
  _Self local_1730;
  _Self local_1728;
  undefined1 *local_1720;
  undefined4 local_16f4;
  reference local_16f0;
  _Self local_16e8;
  _Self local_16e0;
  undefined1 *local_16d8;
  undefined1 local_16d0 [104];
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffe998;
  HomomorphismModel *in_stack_ffffffffffffe9a0;
  duration<long,_std::ratio<1L,_1000L>_> local_1650 [3];
  undefined1 in_stack_ffffffffffffe9cf;
  HomomorphismAssignments *in_stack_ffffffffffffe9d0;
  Domains *in_stack_ffffffffffffe9d8;
  undefined1 in_stack_ffffffffffffe9e7;
  HomomorphismSearcher *in_stack_ffffffffffffe9e8;
  vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
  *in_stack_ffffffffffffec90;
  HomomorphismModel *in_stack_ffffffffffffec98;
  loooong *in_stack_ffffffffffffed40;
  unsigned_long_long *in_stack_ffffffffffffed48;
  unsigned_long_long *in_stack_ffffffffffffed50;
  Domains *in_stack_ffffffffffffed58;
  HomomorphismAssignments *in_stack_ffffffffffffed60;
  HomomorphismSearcher *in_stack_ffffffffffffed68;
  int in_stack_ffffffffffffed80;
  RestartsSchedule *in_stack_ffffffffffffed88;
  undefined1 local_170 [104];
  int local_108;
  byte local_101;
  undefined8 local_100;
  undefined4 local_dc;
  allocator<gss::innards::HomomorphismDomain> local_d5 [196];
  byte local_11;
  
  local_11 = 0;
  gss::HomomorphismResult::HomomorphismResult((HomomorphismResult *)in_stack_ffffffffffffe740);
  gss::innards::HomomorphismDomain::HomomorphismDomain
            ((HomomorphismDomain *)in_stack_ffffffffffffe740,in_stack_ffffffffffffe73c);
  std::allocator<gss::innards::HomomorphismDomain>::allocator
            ((allocator<gss::innards::HomomorphismDomain> *)0x13e784);
  std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>::
  vector((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
          *)CONCAT17(in_stack_ffffffffffffe767,in_stack_ffffffffffffe760),in_stack_ffffffffffffe758,
         in_stack_ffffffffffffe750,(allocator_type *)in_stack_ffffffffffffe748);
  std::allocator<gss::innards::HomomorphismDomain>::~allocator(local_d5);
  gss::innards::HomomorphismDomain::~HomomorphismDomain((HomomorphismDomain *)0x13e7c5);
  bVar1 = gss::innards::HomomorphismModel::initialise_domains
                    (in_stack_ffffffffffffec98,in_stack_ffffffffffffec90);
  if (bVar1) {
    gss::innards::HomomorphismAssignments::HomomorphismAssignments
              ((HomomorphismAssignments *)0x13e8ae);
    std::
    vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
    ::reserve(in_stack_ffffffffffffe770,in_stack_ffffffffffffe768);
    local_100 = std::chrono::_V2::steady_clock::now();
    local_101 = 0;
    local_108 = 0;
    std::function<bool(gss::innards::HomomorphismAssignments_const&)>::
    function<(anonymous_namespace)::SequentialSolver::solve()::_lambda(gss::innards::HomomorphismAssignments_const&)_1_,void>
              ((function<bool_(const_gss::innards::HomomorphismAssignments_&)> *)
               in_stack_ffffffffffffe750,(anon_class_1_0_00000001 *)in_stack_ffffffffffffe748);
    gss::innards::HomomorphismSearcher::HomomorphismSearcher
              (in_stack_ffffffffffffe790,(HomomorphismModel *)in_stack_ffffffffffffe788,
               in_stack_ffffffffffffe780,in_stack_ffffffffffffe778,
               (shared_ptr<gss::innards::Proof> *)in_stack_ffffffffffffe770);
    std::function<bool_(const_gss::innards::HomomorphismAssignments_&)>::~function
              ((function<bool_(const_gss::innards::HomomorphismAssignments_&)> *)0x13e96c);
    while (__val = (uint)(in_stack_ffffffffffffe768 >> 0x20), ((local_101 ^ 0xff) & 1) != 0) {
      local_108 = local_108 + 1;
      local_101 = gss::innards::
                  Watches<gss::innards::HomomorphismAssignment,gss::innards::HomomorphismAssignmentWatchTable>
                  ::
                  apply_new_nogoods<(anonymous_namespace)::SequentialSolver::solve()::_lambda(gss::innards::HomomorphismAssignment_const&)_1_>
                            (in_stack_ffffffffffffe788,
                             (anon_class_16_2_c26f802a *)in_stack_ffffffffffffe780);
      __val = (uint)(in_stack_ffffffffffffe768 >> 0x20);
      if ((bool)local_101) {
        in_RDI->complete = true;
        break;
      }
      gss::innards::
      Watches<gss::innards::HomomorphismAssignment,_gss::innards::HomomorphismAssignmentWatchTable>
      ::clear_new_nogoods((Watches<gss::innards::HomomorphismAssignment,_gss::innards::HomomorphismAssignmentWatchTable>
                           *)in_stack_ffffffffffffe740);
      in_RDI->propagations = in_RDI->propagations + 1;
      bVar1 = gss::innards::HomomorphismSearcher::propagate
                        (in_stack_ffffffffffffe9e8,(bool)in_stack_ffffffffffffe9e7,
                         in_stack_ffffffffffffe9d8,in_stack_ffffffffffffe9d0,
                         (bool)in_stack_ffffffffffffe9cf);
      if (bVar1) {
        gss::innards::HomomorphismAssignments::HomomorphismAssignments
                  ((HomomorphismAssignments *)in_stack_ffffffffffffe740,
                   (HomomorphismAssignments *)
                   CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
        in_stack_ffffffffffffe740 =
             (HomomorphismSearcher *)
             std::unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>::
             operator*((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                        *)in_stack_ffffffffffffe740);
        in_stack_ffffffffffffe738 = 0;
        SVar2 = gss::innards::HomomorphismSearcher::restarting_search
                          (in_stack_ffffffffffffed68,in_stack_ffffffffffffed60,
                           in_stack_ffffffffffffed58,in_stack_ffffffffffffed50,
                           in_stack_ffffffffffffed48,in_stack_ffffffffffffed40,
                           in_stack_ffffffffffffed80,in_stack_ffffffffffffed88);
        switch(SVar2) {
        case Aborted:
          local_101 = 1;
          break;
        case Unsatisfiable:
        case UnsatisfiableAndBackjumpUsingLackey:
          in_RDI->complete = true;
          local_101 = 1;
          break;
        case Satisfiable:
          gss::innards::HomomorphismSearcher::save_result
                    (in_stack_ffffffffffffe840,in_stack_ffffffffffffe838,in_stack_ffffffffffffe830);
          in_RDI->complete = true;
          local_101 = 1;
          break;
        case SatisfiableButKeepGoing:
          in_RDI->complete = true;
          local_101 = 1;
          break;
        case Restart:
        }
        gss::innards::HomomorphismAssignments::~HomomorphismAssignments
                  ((HomomorphismAssignments *)0x13ec4e);
      }
      else {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x10));
        if (bVar1) {
          std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x13ec78);
          gss::innards::Proof::root_propagation_failed((Proof *)0x13ec80);
        }
        in_RDI->complete = true;
        local_101 = 1;
      }
      pRVar4 = std::unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>::
               operator->((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                           *)0x13ecb0);
      (*pRVar4->_vptr_RestartsSchedule[3])();
    }
    pRVar4 = std::unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>::
             operator->((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                         *)0x13ecd8);
    uVar3 = (*pRVar4->_vptr_RestartsSchedule[5])();
    if ((uVar3 & 1) != 0) {
      std::__cxx11::to_string(__val);
      std::operator+((char *)in_stack_ffffffffffffe748,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe740);
      std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe740);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe740);
    }
    __lhs = &in_RDI->extra_stats;
    std::__cxx11::to_string(__val);
    std::operator+((char *)in_stack_ffffffffffffe748,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe740);
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe740);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe740);
    pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &in_RDI->extra_stats;
    this_00 = (HomomorphismModel *)std::chrono::_V2::steady_clock::now();
    __rhs = std::chrono::operator-
                      ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_ffffffffffffe748,
                       (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                        *)in_stack_ffffffffffffe740);
    __rhs_00 = std::chrono::
               duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                         ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                          CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
    local_1650[0].__r = __rhs_00.__r;
    std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(local_1650);
    std::__cxx11::to_string((long)__lhs);
    std::operator+((char *)in_stack_ffffffffffffe748,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe740);
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe740);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe740);
    bVar1 = gss::innards::might_have_watches((HomomorphismParams *)0x13ef1c);
    if (bVar1) {
      std::__cxx11::
      list<gss::innards::Nogood<gss::innards::HomomorphismAssignment>,_std::allocator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>
      ::size((list<gss::innards::Nogood<gss::innards::HomomorphismAssignment>,_std::allocator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>
              *)in_stack_ffffffffffffe740);
      std::__cxx11::to_string((unsigned_long)pbVar6);
      std::operator+((char *)in_stack_ffffffffffffe748,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffe740);
      std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffe750,in_stack_ffffffffffffe748);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe740);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe740);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 0x13efb8);
      local_16d8 = local_170;
      local_16e0._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<gss::innards::Nogood<gss::innards::HomomorphismAssignment>,_std::allocator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>
           ::begin((list<gss::innards::Nogood<gss::innards::HomomorphismAssignment>,_std::allocator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>
                    *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
      local_16e8._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<gss::innards::Nogood<gss::innards::HomomorphismAssignment>,_std::allocator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>
           ::end((list<gss::innards::Nogood<gss::innards::HomomorphismAssignment>,_std::allocator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>
                  *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
      while (bVar1 = std::operator==(&local_16e0,&local_16e8), ((bVar1 ^ 0xffU) & 1) != 0) {
        local_16f0 = std::
                     _List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>::
                     operator*((_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>
                                *)0x13f025);
        sVar5 = std::
                vector<gss::innards::HomomorphismAssignment,_std::allocator<gss::innards::HomomorphismAssignment>_>
                ::size(&local_16f0->literals);
        local_16f4 = (undefined4)sVar5;
        in_stack_ffffffffffffe750 =
             (value_type *)
             std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
             operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)__rhs.__r,(key_type *)pbVar6);
        in_stack_ffffffffffffe750->v = in_stack_ffffffffffffe750->v + 1;
        std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>::operator++
                  (&local_16e0);
      }
      std::__cxx11::string::string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe750);
      local_1720 = local_16d0;
      local_1728._M_node =
           (_Base_ptr)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
      local_1730._M_node =
           (_Base_ptr)
           std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
      while (bVar1 = std::operator==(&local_1728,&local_1730), ((bVar1 ^ 0xffU) & 1) != 0) {
        std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator*
                  ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)0x13f1e0);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe740,
                   (char *)CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
        std::__cxx11::to_string((int)((ulong)pbVar6 >> 0x20));
        std::operator+(in_stack_ffffffffffffe748,(char *)in_stack_ffffffffffffe740);
        std::__cxx11::to_string((int)((ulong)pbVar6 >> 0x20));
        std::operator+(pbVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              __rhs_00.__r);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe740,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffe73c,in_stack_ffffffffffffe738));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe740);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe740);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe740);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffe740);
        std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++
                  ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)in_stack_ffffffffffffe740);
      }
      pbVar6 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &in_RDI->extra_stats;
      std::operator+((char *)__lhs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs.__r)
      ;
      std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffe750,pbVar6);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe740);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffe740);
      std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                 0x13f3dd);
    }
    gss::innards::HomomorphismModel::add_extra_stats(this_00,in_stack_ffffffffffffe998);
    local_11 = 1;
    local_dc = 1;
    gss::innards::HomomorphismSearcher::~HomomorphismSearcher(in_stack_ffffffffffffe740);
    gss::innards::HomomorphismAssignments::~HomomorphismAssignments
              ((HomomorphismAssignments *)0x13f467);
  }
  else {
    in_RDI->complete = true;
    gss::innards::HomomorphismModel::add_extra_stats
              (in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998);
    local_11 = 1;
    local_dc = 1;
  }
  std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>::
  ~vector((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           *)in_stack_ffffffffffffe750);
  if ((local_11 & 1) == 0) {
    gss::HomomorphismResult::~HomomorphismResult((HomomorphismResult *)in_stack_ffffffffffffe740);
  }
  return in_RDI;
}

Assistant:

auto solve() -> HomomorphismResult
        {
            HomomorphismResult result;

            // domains
            Domains domains(model.pattern_size, HomomorphismDomain{model.target_size});
            if (! model.initialise_domains(domains)) {
                result.complete = true;
                model.add_extra_stats(result.extra_stats);
                return result;
            }

            // assignments
            HomomorphismAssignments assignments;
            assignments.values.reserve(model.pattern_size);

            // start search timer
            auto search_start_time = steady_clock::now();

            // do the search
            bool done = false;
            unsigned number_of_restarts = 0;

            HomomorphismSearcher searcher(
                model, params, [](const HomomorphismAssignments &) -> bool { return true; }, proof);

            while (! done) {
                ++number_of_restarts;

                // start watching new nogoods
                done = searcher.watches.apply_new_nogoods(
                    [&](const HomomorphismAssignment & assignment) {
                        for (auto & d : domains)
                            if (d.v == assignment.pattern_vertex) {
                                d.values.reset(assignment.target_vertex);
                                d.count = d.values.count();
                                done = done || (0 == d.count);
                                break;
                            }
                    });

                if (done) {
                    result.complete = true;
                    break;
                }

                searcher.watches.clear_new_nogoods();

                ++result.propagations;
                if (searcher.propagate(true, domains, assignments, params.propagate_using_lackey != PropagateUsingLackey::Never)) {
                    auto assignments_copy = assignments;

                    switch (searcher.restarting_search(assignments_copy, domains, result.nodes, result.propagations,
                        result.solution_count, 0, *params.restarts_schedule)) {
                    case SearchResult::Satisfiable:
                        searcher.save_result(assignments_copy, result);
                        result.complete = true;
                        done = true;
                        break;

                    case SearchResult::SatisfiableButKeepGoing:
                        result.complete = true;
                        done = true;
                        break;

                    case SearchResult::UnsatisfiableAndBackjumpUsingLackey:
                    case SearchResult::Unsatisfiable:
                        result.complete = true;
                        done = true;
                        break;

                    case SearchResult::Aborted:
                        done = true;
                        break;

                    case SearchResult::Restart:
                        break;
                    }
                }
                else {
                    if (proof)
                        proof->root_propagation_failed();
                    result.complete = true;
                    done = true;
                }

                params.restarts_schedule->did_a_restart();
            }

            if (params.restarts_schedule->might_restart())
                result.extra_stats.emplace_back("restarts = " + to_string(number_of_restarts));

            result.extra_stats.emplace_back("shape_graphs = " + to_string(model.max_graphs));

            result.extra_stats.emplace_back("search_time = " + to_string(duration_cast<milliseconds>(steady_clock::now() - search_start_time).count()));

            if (might_have_watches(params)) {
                result.extra_stats.emplace_back("nogoods_size = " + to_string(searcher.watches.nogoods.size()));

                map<int, int> nogoods_lengths;
                for (auto & n : searcher.watches.nogoods)
                    nogoods_lengths[n.literals.size()]++;

                string nogoods_lengths_str;
                for (auto & n : nogoods_lengths) {
                    nogoods_lengths_str += " ";
                    nogoods_lengths_str += to_string(n.first) + ":" + to_string(n.second);
                }
                result.extra_stats.emplace_back("nogoods_lengths =" + nogoods_lengths_str);
            }

            model.add_extra_stats(result.extra_stats);
            return result;
        }